

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstractions.hpp
# Opt level: O1

bool __thiscall
Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::nextStep
          (Path *this,uint baseDepth)

{
  _Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
  _Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar2 = Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
          get<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1)_1_>
                    ();
  if (bVar2) {
    push(this,0);
    bVar2 = true;
  }
  else {
    _Var1._M_head_impl =
         (this->termIdx)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
         ._M_head_impl;
    Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
    get<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1&)_1_>
              ((Path *)this,
               (int)((ulong)((long)(_Var1._M_head_impl)->_cursor -
                            (long)(_Var1._M_head_impl)->_stack) >> 4) +
               (uint)(this->litIdx).
                     super_OptionBase<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::LiteralEntry>
                     ._isSome);
    uVar4 = 2;
    if (2 < baseDepth) {
      uVar4 = (ulong)baseDepth;
    }
    while( true ) {
      _Var1._M_head_impl =
           (this->termIdx)._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
           ._M_head_impl;
      uVar3 = (long)(_Var1._M_head_impl)->_cursor - (long)(_Var1._M_head_impl)->_stack;
      bVar2 = (this->litIdx).
              super_OptionBase<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::LiteralEntry>
              ._isSome;
      if (((long)uVar3 >> 4) + (ulong)bVar2 + 1 < uVar4) break;
      bVar2 = Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
              get<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1)_2_>
                        ((Path *)this,(int)(uVar3 >> 4) + (uint)bVar2);
      if (bVar2) break;
      _Var1._M_head_impl =
           (this->termIdx)._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
           ._M_head_impl;
      if ((_Var1._M_head_impl)->_cursor == (_Var1._M_head_impl)->_stack) {
        (this->litIdx).
        super_OptionBase<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::LiteralEntry>
        ._isSome = false;
      }
      else {
        (_Var1._M_head_impl)->_cursor = (_Var1._M_head_impl)->_cursor + 0xffffffffffffffff;
      }
      _Var1._M_head_impl =
           (this->termIdx)._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
           ._M_head_impl;
      Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
      get<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1&)_2_>
                ((Path *)this,
                 (int)((ulong)((long)(_Var1._M_head_impl)->_cursor -
                              (long)(_Var1._M_head_impl)->_stack) >> 4) +
                 (uint)(this->litIdx).
                       super_OptionBase<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::LiteralEntry>
                       ._isSome);
    }
    _Var1._M_head_impl =
         (this->termIdx)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
         ._M_head_impl;
    uVar4 = (ulong)(this->litIdx).
                   super_OptionBase<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::LiteralEntry>
                   ._isSome +
            ((long)(_Var1._M_head_impl)->_cursor - (long)(_Var1._M_head_impl)->_stack >> 4) + 1;
    bVar2 = uVar4 != 1 && baseDepth <= uVar4;
  }
  return bVar2;
}

Assistant:

bool nextStep(unsigned baseDepth) {
      if (top([](auto t){ return t.canPush(); })) {
        push(0);
        return true;
      } else {
        top([](auto& x) { x.idx++; });
        while(depth() > 1 && depth() >= baseDepth && !top([&](auto t) { return t.inBounds(); })) {
          pop();
          top([](auto& x) { x.idx++; });
        }
        if (depth() < baseDepth || depth() == 1) {
          return false;
        } else {
          return true;
        }
      }
    }